

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O3

int64_t __thiscall
icu_63::OlsonTimeZone::transitionTimeInSeconds(OlsonTimeZone *this,int16_t transIdx)

{
  int32_t iVar1;
  int32_t iVar2;
  int iVar3;
  short sVar4;
  
  if (transIdx < this->transitionCountPre32) {
    iVar1 = this->transitionTimesPre32[transIdx * 2];
    iVar2 = this->transitionTimesPre32[transIdx * 2 + 1];
  }
  else {
    sVar4 = transIdx - this->transitionCountPre32;
    if (sVar4 < this->transitionCount32) {
      return (long)this->transitionTimes32[sVar4];
    }
    iVar3 = (int)(short)(sVar4 - this->transitionCount32);
    iVar1 = this->transitionTimesPost32[iVar3 * 2];
    iVar2 = this->transitionTimesPost32[iVar3 * 2 + 1];
  }
  return CONCAT44(iVar1,iVar2);
}

Assistant:

int64_t
OlsonTimeZone::transitionTimeInSeconds(int16_t transIdx) const {
    U_ASSERT(transIdx >= 0 && transIdx < transitionCount()); 

    if (transIdx < transitionCountPre32) {
        return (((int64_t)((uint32_t)transitionTimesPre32[transIdx << 1])) << 32)
            | ((int64_t)((uint32_t)transitionTimesPre32[(transIdx << 1) + 1]));
    }

    transIdx -= transitionCountPre32;
    if (transIdx < transitionCount32) {
        return (int64_t)transitionTimes32[transIdx];
    }

    transIdx -= transitionCount32;
    return (((int64_t)((uint32_t)transitionTimesPost32[transIdx << 1])) << 32)
        | ((int64_t)((uint32_t)transitionTimesPost32[(transIdx << 1) + 1]));
}